

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglColorClearCase.cpp
# Opt level: O3

void deqp::egl::renderClear(EGLint api,ApiFunctions *func,ClearOp *clear)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec4 local_40;
  
  if (api < 4) {
    if (api == 1) {
      iVar1 = clear->x;
      iVar2 = clear->y;
      iVar3 = clear->width;
      iVar4 = clear->height;
      tcu::RGBA::toVec(&clear->color);
      gles1::clear(iVar1,iVar2,iVar3,iVar4,&local_40);
    }
    else if (api == 2) {
      iVar1 = clear->x;
      iVar2 = clear->y;
      iVar3 = clear->width;
      iVar4 = clear->height;
      tcu::RGBA::toVec(&clear->color);
      vg::clear(iVar1,iVar2,iVar3,iVar4,&local_40);
    }
  }
  else if ((api == 4) || (api == 0x40)) {
    iVar1 = clear->x;
    iVar2 = clear->y;
    iVar3 = clear->width;
    iVar4 = clear->height;
    tcu::RGBA::toVec(&clear->color);
    gles2::clear(&func->gl,iVar1,iVar2,iVar3,iVar4,&local_40);
  }
  return;
}

Assistant:

static void renderClear (EGLint api, const ApiFunctions& func, const ClearOp& clear)
{
	switch (api)
	{
		case EGL_OPENGL_ES_BIT:			gles1::clear(clear.x, clear.y, clear.width, clear.height, clear.color.toVec());				break;
		case EGL_OPENGL_ES2_BIT:		gles2::clear(func.gl, clear.x, clear.y, clear.width, clear.height, clear.color.toVec());	break;
		case EGL_OPENGL_ES3_BIT_KHR:	gles2::clear(func.gl, clear.x, clear.y, clear.width, clear.height, clear.color.toVec());	break;
		case EGL_OPENVG_BIT:			vg::clear	(clear.x, clear.y, clear.width, clear.height, clear.color.toVec());				break;
		default:
			DE_ASSERT(DE_FALSE);
	}
}